

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_graph_algorithms.cpp
# Opt level: O2

unordered_map<geometrycentral::surface::Vertex,_double,_std::hash<geometrycentral::surface::Vertex>,_std::equal_to<geometrycentral::surface::Vertex>,_std::allocator<std::pair<const_geometrycentral::surface::Vertex,_double>_>_>
* __thiscall
geometrycentral::surface::vertexDijkstraDistanceWithinRadius
          (unordered_map<geometrycentral::surface::Vertex,_double,_std::hash<geometrycentral::surface::Vertex>,_std::equal_to<geometrycentral::surface::Vertex>,_std::allocator<std::pair<const_geometrycentral::surface::Vertex,_double>_>_>
           *__return_storage_ptr__,surface *this,IntrinsicGeometryInterface *geom,Vertex startVert,
          double ballRad)

{
  Vertex v;
  bool bVar1;
  size_t i;
  iterator iVar2;
  mapped_type *pmVar3;
  Vertex currVert;
  double targetDist;
  Vertex targetVert;
  priority_queue<std::tuple<double,_geometrycentral::surface::Vertex>,_std::vector<std::tuple<double,_geometrycentral::surface::Vertex>,_std::allocator<std::tuple<double,_geometrycentral::surface::Vertex>_>_>,_std::greater<std::tuple<double,_geometrycentral::surface::Vertex>_>_>
  toProcess;
  Edge e;
  NavigationIteratorBase<geometrycentral::surface::VertexAdjacentEdgeNavigator> __end3;
  NavigationIteratorBase<geometrycentral::surface::VertexAdjacentEdgeNavigator> __begin3;
  key_type local_188;
  mapped_type local_178;
  double local_170;
  double local_168;
  double local_160;
  Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh> local_158;
  priority_queue<std::tuple<double,_geometrycentral::surface::Vertex>,_std::vector<std::tuple<double,_geometrycentral::surface::Vertex>,_std::allocator<std::tuple<double,_geometrycentral::surface::Vertex>_>_>,_std::greater<std::tuple<double,_geometrycentral::surface::Vertex>_>_>
  local_148;
  Edge local_128;
  Vertex local_118;
  NavigationIteratorBase<geometrycentral::surface::VertexAdjacentEdgeNavigator> local_108;
  NavigationIteratorBase<geometrycentral::surface::VertexAdjacentEdgeNavigator> local_d0;
  NavigationSetBase<geometrycentral::surface::VertexAdjacentEdgeNavigator> local_98;
  
  local_118.super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.
  ind = (size_t)startVert.
                super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>
                .mesh;
  local_170 = ballRad;
  local_118.super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.
  mesh = (ParentMeshT *)geom;
  IntrinsicGeometryInterface::requireEdgeLengths((IntrinsicGeometryInterface *)this);
  local_148.c.
  super__Vector_base<std::tuple<double,_geometrycentral::surface::Vertex>,_std::allocator<std::tuple<double,_geometrycentral::surface::Vertex>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_98.firstE.useImplicitTwin = false;
  local_98.firstE._1_7_ = 0;
  (__return_storage_ptr__->_M_h)._M_buckets = &(__return_storage_ptr__->_M_h)._M_single_bucket;
  (__return_storage_ptr__->_M_h)._M_bucket_count = 1;
  (__return_storage_ptr__->_M_h)._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (__return_storage_ptr__->_M_h)._M_element_count = 0;
  (__return_storage_ptr__->_M_h)._M_rehash_policy._M_max_load_factor = 1.0;
  (__return_storage_ptr__->_M_h)._M_rehash_policy._M_next_resize = 0;
  (__return_storage_ptr__->_M_h)._M_single_bucket = (__node_base_ptr)0x0;
  local_148.c.
  super__Vector_base<std::tuple<double,_geometrycentral::surface::Vertex>,_std::allocator<std::tuple<double,_geometrycentral::surface::Vertex>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_148.c.
  super__Vector_base<std::tuple<double,_geometrycentral::surface::Vertex>,_std::allocator<std::tuple<double,_geometrycentral::surface::Vertex>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  ::std::
  priority_queue<std::tuple<double,geometrycentral::surface::Vertex>,std::vector<std::tuple<double,geometrycentral::surface::Vertex>,std::allocator<std::tuple<double,geometrycentral::surface::Vertex>>>,std::greater<std::tuple<double,geometrycentral::surface::Vertex>>>
  ::emplace<double,geometrycentral::surface::Vertex&>
            ((priority_queue<std::tuple<double,geometrycentral::surface::Vertex>,std::vector<std::tuple<double,geometrycentral::surface::Vertex>,std::allocator<std::tuple<double,geometrycentral::surface::Vertex>>>,std::greater<std::tuple<double,geometrycentral::surface::Vertex>>>
              *)&local_148,(double *)&local_98,&local_118);
  while (local_148.c.
         super__Vector_base<std::tuple<double,_geometrycentral::surface::Vertex>,_std::allocator<std::tuple<double,_geometrycentral::surface::Vertex>_>_>
         ._M_impl.super__Vector_impl_data._M_start !=
         local_148.c.
         super__Vector_base<std::tuple<double,_geometrycentral::surface::Vertex>,_std::allocator<std::tuple<double,_geometrycentral::surface::Vertex>_>_>
         ._M_impl.super__Vector_impl_data._M_finish) {
    local_178 = ((local_148.c.
                  super__Vector_base<std::tuple<double,_geometrycentral::surface::Vertex>,_std::allocator<std::tuple<double,_geometrycentral::surface::Vertex>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->
                super__Tuple_impl<0UL,_double,_geometrycentral::surface::Vertex>).
                super__Head_base<0UL,_double,_false>._M_head_impl;
    local_188.super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>
    .mesh = ((local_148.c.
              super__Vector_base<std::tuple<double,_geometrycentral::surface::Vertex>,_std::allocator<std::tuple<double,_geometrycentral::surface::Vertex>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->
            super__Tuple_impl<0UL,_double,_geometrycentral::surface::Vertex>).
            super__Tuple_impl<1UL,_geometrycentral::surface::Vertex>.
            super__Head_base<1UL,_geometrycentral::surface::Vertex,_false>._M_head_impl.
            super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.
            mesh;
    local_188.super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>
    .ind = ((local_148.c.
             super__Vector_base<std::tuple<double,_geometrycentral::surface::Vertex>,_std::allocator<std::tuple<double,_geometrycentral::surface::Vertex>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->
           super__Tuple_impl<0UL,_double,_geometrycentral::surface::Vertex>).
           super__Tuple_impl<1UL,_geometrycentral::surface::Vertex>.
           super__Head_base<1UL,_geometrycentral::surface::Vertex,_false>._M_head_impl.
           super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.
           ind;
    ::std::
    priority_queue<std::tuple<double,_geometrycentral::surface::Vertex>,_std::vector<std::tuple<double,_geometrycentral::surface::Vertex>,_std::allocator<std::tuple<double,_geometrycentral::surface::Vertex>_>_>,_std::greater<std::tuple<double,_geometrycentral::surface::Vertex>_>_>
    ::pop(&local_148);
    iVar2 = ::std::
            _Hashtable<geometrycentral::surface::Vertex,_std::pair<const_geometrycentral::surface::Vertex,_double>,_std::allocator<std::pair<const_geometrycentral::surface::Vertex,_double>_>,_std::__detail::_Select1st,_std::equal_to<geometrycentral::surface::Vertex>,_std::hash<geometrycentral::surface::Vertex>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(&__return_storage_ptr__->_M_h,&local_188);
    if (iVar2.
        super__Node_iterator_base<std::pair<const_geometrycentral::surface::Vertex,_double>,_true>.
        _M_cur == (__node_type *)0x0) {
      pmVar3 = ::std::__detail::
               _Map_base<geometrycentral::surface::Vertex,_std::pair<const_geometrycentral::surface::Vertex,_double>,_std::allocator<std::pair<const_geometrycentral::surface::Vertex,_double>_>,_std::__detail::_Select1st,_std::equal_to<geometrycentral::surface::Vertex>,_std::hash<geometrycentral::surface::Vertex>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<geometrycentral::surface::Vertex,_std::pair<const_geometrycentral::surface::Vertex,_double>,_std::allocator<std::pair<const_geometrycentral::surface::Vertex,_double>_>,_std::__detail::_Select1st,_std::equal_to<geometrycentral::surface::Vertex>,_std::hash<geometrycentral::surface::Vertex>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)__return_storage_ptr__,&local_188);
      *pmVar3 = local_178;
      Vertex::adjacentEdges(&local_98,&local_188);
      NavigationSetBase<geometrycentral::surface::VertexAdjacentEdgeNavigator>::begin
                (&local_d0,&local_98);
      local_108.state.currE.firstHe.
      super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.mesh
           = local_98.cachedEndIter.state.currE.firstHe.
             super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
             .mesh;
      local_108.state.currE.firstHe.
      super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.ind =
           local_98.cachedEndIter.state.currE.firstHe.
           super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.
           ind;
      local_108.justStarted = local_98.cachedEndIter.justStarted;
      local_108._49_7_ = local_98.cachedEndIter._49_7_;
      local_108.state.currE.useImplicitTwin = local_98.cachedEndIter.state.currE.useImplicitTwin;
      local_108.state.currE._1_7_ = local_98.cachedEndIter.state.currE._1_7_;
      local_108.state.currE.currHe.
      super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.mesh
           = local_98.cachedEndIter.state.currE.currHe.
             super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
             .mesh;
      local_108.state.currE.currHe.
      super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.ind =
           local_98.cachedEndIter.state.currE.currHe.
           super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.
           ind;
      local_108.state.currE.processingIncoming =
           local_98.cachedEndIter.state.currE.processingIncoming;
      local_108.state.currE._25_7_ = local_98.cachedEndIter.state.currE._25_7_;
      while( true ) {
        bVar1 = NavigationIteratorBase<geometrycentral::surface::VertexAdjacentEdgeNavigator>::
                operator!=(&local_d0,&local_108);
        if (!bVar1) break;
        if ((local_d0.state.currE.currHe.
             super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
            .mesh)->useImplicitTwinFlag == true) {
          local_128.
          super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>.ind =
               local_d0.state.currE.currHe.
               super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
               .ind >> 1;
        }
        else {
          local_128.
          super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>.ind =
               ((local_d0.state.currE.currHe.
                 super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                .mesh)->heEdgeArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
               ._M_impl.super__Vector_impl_data._M_start
               [local_d0.state.currE.currHe.
                super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                .ind];
        }
        local_128.
        super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>.mesh =
             local_d0.state.currE.currHe.
             super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
             .mesh;
        v.super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.ind
             = local_188.
               super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>
               .ind;
        v.super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.
        mesh = local_188.
               super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>
               .mesh;
        local_168 = *(double *)
                     (*(long *)(this + 0x380) +
                     local_128.
                     super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>
                     .ind * 8);
        local_158 = (Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>
                     )Edge::otherVertex(&local_128,v);
        local_160 = local_168 + local_178;
        if (local_160 <= local_170) {
          iVar2 = ::std::
                  _Hashtable<geometrycentral::surface::Vertex,_std::pair<const_geometrycentral::surface::Vertex,_double>,_std::allocator<std::pair<const_geometrycentral::surface::Vertex,_double>_>,_std::__detail::_Select1st,_std::equal_to<geometrycentral::surface::Vertex>,_std::hash<geometrycentral::surface::Vertex>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  ::find(&__return_storage_ptr__->_M_h,(key_type *)&local_158);
          if (iVar2.
              super__Node_iterator_base<std::pair<const_geometrycentral::surface::Vertex,_double>,_true>
              ._M_cur == (__node_type *)0x0) {
            ::std::
            priority_queue<std::tuple<double,geometrycentral::surface::Vertex>,std::vector<std::tuple<double,geometrycentral::surface::Vertex>,std::allocator<std::tuple<double,geometrycentral::surface::Vertex>>>,std::greater<std::tuple<double,geometrycentral::surface::Vertex>>>
            ::emplace<double&,geometrycentral::surface::Vertex&>
                      ((priority_queue<std::tuple<double,geometrycentral::surface::Vertex>,std::vector<std::tuple<double,geometrycentral::surface::Vertex>,std::allocator<std::tuple<double,geometrycentral::surface::Vertex>>>,std::greater<std::tuple<double,geometrycentral::surface::Vertex>>>
                        *)&local_148,&local_160,(Vertex *)&local_158);
          }
        }
        NavigationIteratorBase<geometrycentral::surface::VertexAdjacentEdgeNavigator>::operator++
                  (&local_d0);
      }
    }
  }
  ::std::
  _Vector_base<std::tuple<double,_geometrycentral::surface::Vertex>,_std::allocator<std::tuple<double,_geometrycentral::surface::Vertex>_>_>
  ::~_Vector_base((_Vector_base<std::tuple<double,_geometrycentral::surface::Vertex>,_std::allocator<std::tuple<double,_geometrycentral::surface::Vertex>_>_>
                   *)&local_148);
  return __return_storage_ptr__;
}

Assistant:

std::unordered_map<Vertex, double> vertexDijkstraDistanceWithinRadius(IntrinsicGeometryInterface& geom,
                                                                      Vertex startVert, double ballRad) {

  // Gather values
  SurfaceMesh& mesh = geom.mesh;
  geom.requireEdgeLengths();

  // Search state: incoming halfedges to each vertex, once discovered
  std::unordered_map<Vertex, double> shortestDist;

  // Search state: visible neighbors eligible to expand to
  using WeightedVertex = std::tuple<double, Vertex>;
  std::priority_queue<WeightedVertex, std::vector<WeightedVertex>, std::greater<WeightedVertex>> toProcess;

  // Add initial source
  toProcess.emplace(0., startVert);

  while (!toProcess.empty()) {

    // Get the next closest neighbor off the queue
    double currDist = std::get<0>(toProcess.top());
    Vertex currVert = std::get<1>(toProcess.top());
    toProcess.pop();

    // skips stale entries
    if (shortestDist.find(currVert) != shortestDist.end()) continue;

    shortestDist[currVert] = currDist;

    for (Edge e : currVert.adjacentEdges()) {
      double len = geom.edgeLengths[e];
      Vertex targetVert = e.otherVertex(currVert);
      double targetDist = currDist + len;

      if (targetDist <= ballRad && shortestDist.find(targetVert) == shortestDist.end()) {
        toProcess.emplace(targetDist, targetVert);
      }
    }
  }

  return shortestDist;
}